

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::DeallocateStandard<4ul>
               (CommonFields *common,PolicyFunctions *policy)

{
  void *p;
  size_t n;
  allocator<char> alloc;
  allocator<char> local_19;
  
  if ((common->size_ & 1) != 0) {
    CommonFields::backing_array_start(common);
  }
  p = CommonFields::backing_array_start(common);
  n = CommonFields::alloc_size(common,policy->slot_size,4);
  Deallocate<8ul,std::allocator<char>>(&local_19,p,n);
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE void DeallocateStandard(CommonFields& common,
                                                const PolicyFunctions& policy) {
  // Unpoison before returning the memory to the allocator.
  SanitizerUnpoisonMemoryRegion(common.slot_array(),
                                policy.slot_size * common.capacity());

  std::allocator<char> alloc;
  common.infoz().Unregister();
  Deallocate<BackingArrayAlignment(AlignOfSlot)>(
      &alloc, common.backing_array_start(),
      common.alloc_size(policy.slot_size, AlignOfSlot));
}